

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
                *matrix,vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  pointer plVar4;
  node_ptr plVar5;
  void *pvVar6;
  long lVar7;
  long *plVar8;
  undefined4 ***pppuVar9;
  Index IVar10;
  Row_container *pRVar11;
  Chain_column_option CVar12;
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
  *pSVar13;
  bool bVar14;
  node_ptr next;
  _Rb_tree_node_base *p_Var15;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r;
  node_ptr plVar16;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r_1;
  undefined4 local_2e4;
  undefined *local_2e0;
  undefined4 *local_2d8;
  undefined **local_2d0;
  undefined **local_2c8;
  ulong local_2c0;
  shared_count sStack_2b8;
  undefined4 **local_2b0;
  char *local_2a8;
  char *local_2a0;
  shared_count sStack_298;
  undefined **local_290;
  undefined1 local_288;
  undefined8 *local_280;
  undefined ***local_278;
  undefined4 **local_270;
  char *local_268;
  undefined **local_260;
  char *local_258;
  shared_count sStack_250;
  char *local_248;
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  *local_240;
  vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
  *local_238;
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
  local_230;
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
  local_1d0;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_230,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&local_1d0,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_230);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&local_230);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_1d0);
  build_column_values<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_230,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&local_1d0,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_230);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&local_230);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_1d0);
  local_238 = matrix;
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>
  ::
  Set_column<std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
            ((Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>
              *)&local_1d0,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  pppuVar9 = (undefined4 ***)
             CONCAT44(local_230._28_4_,local_230.super_Chain_column_option.pairedColumn_);
  plVar4 = (rows->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_240 = rows;
  IVar10 = local_1d0.super_Row_access_option.columnIndex_;
  pRVar11 = local_1d0.super_Row_access_option.rows_;
  CVar12 = local_1d0.super_Chain_column_option;
  local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  for (plVar16 = (node_ptr)
                 (rows->
                 super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      local_1d0.super_Row_access_option.rows_ = pRVar11, plVar16 != (node_ptr)plVar4;
      plVar16 = plVar16 + 1) {
    plVar5 = (((type *)&plVar16->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_1d0.super_Row_access_option.columnIndex_ = IVar10;
    local_1d0.super_Chain_column_option = CVar12;
    local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (plVar16 != plVar5 && plVar5 != (node_ptr)0x0) {
      plVar5 = plVar16->prev_;
      uVar2 = *(uint *)&plVar5[1].next_;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        local_230._24_8_ = pppuVar9;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x215);
        local_2c0 = local_2c0 & 0xffffffffffffff00;
        local_2c8 = &PTR__lazy_ostream_001de440;
        sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2b0 = (undefined4 **)0x1a9184;
        iVar3 = *(int *)&plVar5[-1].prev_;
        local_2d8 = (undefined4 *)CONCAT44(local_2d8._4_4_,iVar3);
        local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,6);
        local_260 = (undefined **)CONCAT71(local_260._1_7_,iVar3 == 6);
        local_258 = (char *)0x0;
        sStack_250.pi_ = (sp_counted_base *)0x0;
        local_2a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_2a0 = "";
        local_270 = &local_2d8;
        local_230.super_Row_access_option.rows_ =
             (Row_container *)((ulong)local_230.super_Row_access_option.rows_ & 0xffffffffffffff00);
        local_230.super_Row_access_option._0_8_ = &PTR__lazy_ostream_001de900;
        local_230.super_Column_dimension_option.dim_ = 0x1e6118;
        local_230.super_Chain_column_option.pivot_ = 0;
        local_230._24_8_ = &local_270;
        local_2d0 = &local_2e0;
        local_288 = 0;
        local_290 = &PTR__lazy_ostream_001de940;
        local_280 = &boost::unit_test::lazy_ostream::inst;
        local_278 = &local_2d0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_260,&local_2c8,&local_2a8,0x215,1,2,2,"entry.get_column_index()",
                   &local_230,"6",&local_290);
        boost::detail::shared_count::~shared_count(&sStack_250);
        pppuVar9 = (undefined4 ***)local_230._24_8_;
      }
    }
    local_230._28_4_ = SUB84((ulong)pppuVar9 >> 0x20,0);
    IVar10 = local_1d0.super_Row_access_option.columnIndex_;
    pRVar11 = local_1d0.super_Row_access_option.rows_;
    CVar12 = local_1d0.super_Chain_column_option;
    local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  p_Var1 = &local_1d0.column_._M_t._M_impl.super__Rb_tree_header;
  local_1d0.super_Row_access_option.columnIndex_ = 0;
  local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_230.super_Row_access_option._4_4_ =
       SUB84((ulong)local_230.super_Row_access_option._0_8_ >> 0x20,0);
  local_230.super_Row_access_option.columnIndex_ = IVar10;
  local_1d0.super_Column_dimension_option.dim_ = -1;
  local_1d0.super_Chain_column_option.pivot_ = 0xffffffff;
  local_1d0.super_Chain_column_option.pairedColumn_ = 0xffffffff;
  local_230.super_Chain_column_option.pivot_ = CVar12.pivot_;
  local_230.super_Chain_column_option.pairedColumn_ = CVar12.pairedColumn_;
  if (local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    pSVar13 = &local_230;
    local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    pSVar13 = &local_1d0;
    (local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    local_230.column_._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(size_t *)((long)&(pSVar13->column_)._M_t._M_impl.super__Rb_tree_header + 0x20) = 0;
  local_230.operators_._0_4_ = local_1d0.operators_._0_4_;
  local_1d0.operators_._4_4_ = (undefined4)((ulong)local_1d0.operators_ >> 0x20);
  local_230.operators_._4_4_ = local_1d0.operators_._4_4_;
  local_230.entryPool_._0_4_ = local_1d0.entryPool_._0_4_;
  local_1d0.entryPool_._4_4_ = (undefined4)((ulong)local_1d0.entryPool_ >> 0x20);
  local_230.entryPool_._4_4_ = local_1d0.entryPool_._4_4_;
  local_1d0.operators_ = (Field_operators *)0x0;
  local_1d0.entryPool_ = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230.super_Row_access_option.rows_ = pRVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
  local_260 = &PTR__lazy_ostream_001de440;
  sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2d0 = &local_2e0;
  local_2e0 = (undefined *)local_230.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_2d8 = &local_2e4;
  local_2e4 = 4;
  local_2a0 = (char *)0x0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined4 **)0x1a9c77;
  local_268 = "";
  local_278 = &local_2d0;
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001de400;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d8;
  local_2c0 = local_2c0 & 0xffffffffffffff00;
  local_2c8 = &PTR__lazy_ostream_001de940;
  sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2a8._0_1_ =
       (undefined *)local_230.column_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
       (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_298);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
  local_260 = &PTR__lazy_ostream_001de440;
  sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2e0 = (undefined *)local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_2a8 = (char *)CONCAT71(local_2a8._1_7_,
                               (undefined *)
                               local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                               (undefined *)0x0);
  local_2e4 = 0;
  local_2a0 = (char *)0x0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined4 **)0x1a9c77;
  local_268 = "";
  local_2d0 = &local_2e0;
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001de400;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = &local_2d0;
  local_2d8 = &local_2e4;
  local_2c0 = local_2c0 & 0xffffffffffffff00;
  local_2c8 = &PTR__lazy_ostream_001de940;
  sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,&local_260,&local_270,0x21d,1,2,2,"col.size()",&local_290,"0",&local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_298);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar14 = Gudhi::persistence_matrix::operator==
                     ((local_238->
                      super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&local_230);
  local_2c8 = (undefined **)CONCAT71(local_2c8._1_7_,bVar14);
  local_2c0 = 0;
  sStack_2b8.pi_ = (sp_counted_base *)0x0;
  local_260 = (undefined **)0x1b3dd6;
  local_258 = "";
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001de388;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_278 = &local_260;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b8);
  plVar4 = (local_240->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (plVar16 = (node_ptr)
                 (local_240->
                 super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; plVar16 != (node_ptr)plVar4;
      plVar16 = plVar16 + 1) {
    plVar5 = (((type *)&plVar16->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar16 != plVar5 && plVar5 != (node_ptr)0x0) {
      plVar5 = plVar16->prev_;
      uVar2 = *(uint *)&plVar5[1].next_;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x22d,
                   &local_150);
        local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
        local_260 = &PTR__lazy_ostream_001de440;
        sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_248 = "";
        iVar3 = *(int *)&plVar5[-1].prev_;
        local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,iVar3);
        local_2e4 = 6;
        local_2a8 = (char *)CONCAT71(local_2a8._1_7_,iVar3 == 6);
        local_2a0 = (char *)0x0;
        sStack_298.pi_ = (sp_counted_base *)0x0;
        local_270 = (undefined4 **)0x1a9c77;
        local_268 = "";
        local_2d0 = &local_2e0;
        local_288 = 0;
        local_290 = &PTR__lazy_ostream_001de900;
        local_280 = &boost::unit_test::lazy_ostream::inst;
        local_278 = &local_2d0;
        local_2d8 = &local_2e4;
        local_2c0 = local_2c0 & 0xffffffffffffff00;
        local_2c8 = &PTR__lazy_ostream_001de940;
        sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2b0 = &local_2d8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2a8,&local_260,&local_270,0x22d,1,2,2,"entry.get_column_index()",
                   &local_290,"6",&local_2c8);
        boost::detail::shared_count::~shared_count(&sStack_298);
      }
    }
  }
  Gudhi::persistence_matrix::swap(&local_1d0,&local_230);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
  local_260 = &PTR__lazy_ostream_001de440;
  sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2e0 = (undefined *)local_230.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_2e4 = 0;
  local_2a0 = (char *)0x0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined4 **)0x1a9c77;
  local_268 = "";
  local_2d0 = &local_2e0;
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001de400;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = &local_2d0;
  local_2d8 = &local_2e4;
  local_2c0 = local_2c0 & 0xffffffffffffff00;
  local_2c8 = &PTR__lazy_ostream_001de940;
  sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d8;
  local_2a8._0_1_ =
       (undefined *)local_230.column_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
       (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_298);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
  local_260 = &PTR__lazy_ostream_001de440;
  sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2e0 = (undefined *)local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_2a8 = (char *)CONCAT71(local_2a8._1_7_,
                               (undefined *)
                               local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                               (undefined *)0x4);
  local_2e4 = 4;
  local_2a0 = (char *)0x0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined4 **)0x1a9c77;
  local_268 = "";
  local_2d0 = &local_2e0;
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001de400;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = &local_2d0;
  local_2d8 = &local_2e4;
  local_2c0 = local_2c0 & 0xffffffffffffff00;
  local_2c8 = &PTR__lazy_ostream_001de940;
  sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,&local_260,&local_270,0x235,1,2,2,"col.size()",&local_290,"4",&local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_298);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar14 = Gudhi::persistence_matrix::operator==
                     ((local_238->
                      super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&local_1d0);
  local_2c8 = (undefined **)CONCAT71(local_2c8._1_7_,bVar14);
  local_2c0 = 0;
  sStack_2b8.pi_ = (sp_counted_base *)0x0;
  local_260 = (undefined **)0x1b3deb;
  local_258 = "";
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001de388;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_278 = &local_260;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b8);
  plVar4 = (local_240->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (plVar16 = (node_ptr)
                 (local_240->
                 super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; plVar16 != (node_ptr)plVar4;
      plVar16 = plVar16 + 1) {
    plVar5 = (((type *)&plVar16->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar16 != plVar5 && plVar5 != (node_ptr)0x0) {
      plVar5 = plVar16->prev_;
      uVar2 = *(uint *)&plVar5[1].next_;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x245,
                   &local_170);
        local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
        local_260 = &PTR__lazy_ostream_001de440;
        sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_248 = "";
        iVar3 = *(int *)&plVar5[-1].prev_;
        local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,iVar3);
        local_2e4 = 6;
        local_2a8 = (char *)CONCAT71(local_2a8._1_7_,iVar3 == 6);
        local_2a0 = (char *)0x0;
        sStack_298.pi_ = (sp_counted_base *)0x0;
        local_270 = (undefined4 **)0x1a9c77;
        local_268 = "";
        local_2d0 = &local_2e0;
        local_288 = 0;
        local_290 = &PTR__lazy_ostream_001de900;
        local_280 = &boost::unit_test::lazy_ostream::inst;
        local_278 = &local_2d0;
        local_2d8 = &local_2e4;
        local_2c0 = local_2c0 & 0xffffffffffffff00;
        local_2c8 = &PTR__lazy_ostream_001de940;
        sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2b0 = &local_2d8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2a8,&local_260,&local_270,0x245,1,2,2,"entry.get_column_index()",
                   &local_290,"6",&local_2c8);
        boost::detail::shared_count::~shared_count(&sStack_298);
      }
    }
  }
  for (p_Var15 = local_230.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var15 != &local_230.column_._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
    pvVar6 = *(void **)(p_Var15 + 1);
    if ((local_230.super_Row_access_option.rows_ != (Row_container *)0x0) &&
       (lVar7 = *(long *)((long)pvVar6 + 8), lVar7 != 0)) {
      plVar8 = *(long **)((long)pvVar6 + 0x10);
      *plVar8 = lVar7;
      *(long **)(lVar7 + 8) = plVar8;
      *(undefined8 *)((long)pvVar6 + 8) = 0;
      *(undefined8 *)((long)pvVar6 + 0x10) = 0;
    }
    if (pvVar6 != (void *)0x0) {
      lVar7 = *(long *)((long)pvVar6 + 8);
      if (lVar7 != 0) {
        plVar8 = *(long **)((long)pvVar6 + 0x10);
        *plVar8 = lVar7;
        *(long **)(lVar7 + 8) = plVar8;
        *(undefined8 *)((long)pvVar6 + 8) = 0;
        *(undefined8 *)((long)pvVar6 + 0x10) = 0;
      }
      operator_delete(pvVar6,0x20);
    }
  }
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>_>
  ::~_Rb_tree(&local_230.column_._M_t);
  for (p_Var15 = local_1d0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var15 != &local_1d0.column_._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
    pvVar6 = *(void **)(p_Var15 + 1);
    if ((local_1d0.super_Row_access_option.rows_ != (Row_container *)0x0) &&
       (lVar7 = *(long *)((long)pvVar6 + 8), lVar7 != 0)) {
      plVar8 = *(long **)((long)pvVar6 + 0x10);
      *plVar8 = lVar7;
      *(long **)(lVar7 + 8) = plVar8;
      *(undefined8 *)((long)pvVar6 + 8) = 0;
      *(undefined8 *)((long)pvVar6 + 0x10) = 0;
    }
    if (pvVar6 != (void *)0x0) {
      lVar7 = *(long *)((long)pvVar6 + 8);
      if (lVar7 != 0) {
        plVar8 = *(long **)((long)pvVar6 + 0x10);
        *plVar8 = lVar7;
        *(long **)(lVar7 + 8) = plVar8;
        *(undefined8 *)((long)pvVar6 + 8) = 0;
        *(undefined8 *)((long)pvVar6 + 0x10) = 0;
      }
      operator_delete(pvVar6,0x20);
    }
  }
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>_>
  ::~_Rb_tree(&local_1d0.column_._M_t);
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}